

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

string_t duckdb::TernaryLambdaWrapper::
         Operation<duckdb::RegexReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__1,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                   (anon_class_16_2_50904408 fun,string_t a,string_t b,string_t c,ValidityMask *mask
                   ,idx_t idx)

{
  InvalidInputException *this;
  long lVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  string sstring;
  RE2 re;
  undefined8 local_118;
  char *pcStack_110;
  undefined8 local_100;
  long local_f8;
  string local_f0;
  StringPiece local_d0;
  undefined8 local_c0;
  pointer local_b8;
  RE2 local_b0;
  
  local_b8 = b.value._8_8_;
  local_c0 = b.value._0_8_;
  local_f8 = a.value._8_8_;
  local_100 = a.value._0_8_;
  local_118 = c.value._0_8_;
  pcStack_110 = c.value.pointer.ptr;
  local_f0._M_string_length = local_c0 & 0xffffffff;
  local_f0._M_dataplus._M_p = local_b8;
  if (local_f0._M_string_length < 0xd) {
    local_f0._M_dataplus._M_p = (pointer)((long)&local_c0 + 4);
  }
  duckdb_re2::RE2::RE2
            (&local_b0,(StringPiece *)&local_f0,&((fun.info)->super_RegexpBaseBindData).options);
  if ((local_b0._68_4_ & 0x1fffffff) != 0) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    InvalidInputException::InvalidInputException(this,(string *)local_b0.error_);
    __cxa_throw(this,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar1 = local_f8;
  if ((local_100 & 0xffffffff) < 0xd) {
    lVar1 = (long)&local_100 + 4;
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,lVar1,(local_100 & 0xffffffff) + lVar1);
  local_d0.data_ = (char *)((long)&local_118 + 4);
  if (((fun.info)->super_RegexpBaseBindData).field_0x41 == '\x01') {
    local_d0.size_ = local_118 & 0xffffffff;
    if (0xc < local_d0.size_) {
      local_d0.data_ = pcStack_110;
    }
    duckdb_re2::RE2::GlobalReplace(&local_f0,&local_b0,&local_d0);
  }
  else {
    local_d0.size_ = local_118 & 0xffffffff;
    if (0xc < local_d0.size_) {
      local_d0.data_ = pcStack_110;
    }
    duckdb_re2::RE2::Replace(&local_f0,&local_b0,&local_d0);
  }
  aVar2.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(fun.result,&local_f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  duckdb_re2::RE2::~RE2(&local_b0);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

static inline RESULT_TYPE Operation(FUN fun, A_TYPE a, B_TYPE b, C_TYPE c, ValidityMask &mask, idx_t idx) {
		return fun(a, b, c);
	}